

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.h
# Opt level: O1

void google::protobuf::compiler::java::
     MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
               (Context *context,Printer *printer,Descriptor *descriptor,bool immutable,
               string *suffix)

{
  string local_30;
  
  if ((*(long *)(descriptor + 0x18) == 0) &&
     (*(char *)(*(long *)(*(long *)(descriptor + 0x10) + 0x88) + 0x98) == '\x01')) {
    if ((context->options_).annotate_code == true) {
      AnnotationFileName<google::protobuf::Descriptor>(&local_30,descriptor,suffix);
    }
    else {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"");
    }
    PrintGeneratedAnnotation(printer,'$',&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void MaybePrintGeneratedAnnotation(Context* context, io::Printer* printer,
                                   Descriptor* descriptor, bool immutable,
                                   const std::string& suffix = "") {
  if (IsOwnFile(descriptor, immutable)) {
    PrintGeneratedAnnotation(printer, '$',
                             context->options().annotate_code
                                 ? AnnotationFileName(descriptor, suffix)
                                 : "");
  }
}